

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

void __thiscall
google::
sparse_hashtable_destructive_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::advance_past_deleted
          (sparse_hashtable_destructive_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *psVar4;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *psVar5;
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psVar6;
  int *piVar7;
  
  while ((((((this->pos).row_begin._M_current != (this->end).row_begin._M_current ||
            (psVar4 = (this->pos).row_end._M_current, psVar4 != (this->end).row_end._M_current)) ||
           (psVar5 = (this->pos).row_current._M_current,
           psVar5 != (this->end).row_current._M_current)) ||
          ((psVar5 != psVar4 && ((this->pos).col_current != (this->end).col_current)))) &&
         (psVar6 = this->ht, psVar6->num_deleted != 0))) {
    piVar7 = (this->pos).col_current;
    iVar2 = (psVar6->key_info).delkey;
    iVar3 = *piVar7;
    piVar1 = &(psVar6->key_info).super_TransparentHasher.super_Hasher.num_compares_;
    *piVar1 = *piVar1 + 1;
    if (iVar3 + iVar2 != 0) {
      return;
    }
    (this->pos).col_current = piVar7 + 1;
    destructive_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::advance_past_end(&this->pos);
  }
  return;
}

Assistant:

void advance_past_deleted() {
    while (pos != end && ht->test_deleted(*this)) ++pos;
  }